

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[16],unsigned_long,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [16],unsigned_long *Args_1,
          char (*Args_2) [26],char **Args_3,char (*Args_4) [25],unsigned_long *Args_5,
          char (*Args_6) [3],unsigned_long *Args_7,char (*Args_8) [38],char **Args_9,
          char (*Args_10) [11],unsigned_long *Args_11,char (*Args_12) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[16],unsigned_long,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [16])this,(unsigned_long *)Args,(char (*) [26])Args_1,(char **)Args_2,
             (char (*) [25])Args_3,(unsigned_long *)Args_4,(char (*) [3])Args_5,
             (unsigned_long *)Args_6,(char (*) [38])Args_7,(char **)Args_8,(char (*) [11])Args_9,
             (unsigned_long *)Args_10,(char (*) [2])Args_11);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}